

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

char * nk_itoa(char *s,long n)

{
  ulong local_28;
  long i;
  long n_local;
  char *s_local;
  
  if (n == 0) {
    *s = '0';
    s[1] = '\0';
    s_local = s;
  }
  else {
    i = n;
    if (n < 0) {
      *s = '-';
      i = -n;
    }
    local_28 = (ulong)(n < 0);
    for (; 0 < i; i = i / 10) {
      s[local_28] = (char)(i % 10) + '0';
      local_28 = local_28 + 1;
    }
    s[local_28] = '\0';
    n_local = (long)s;
    if (*s == '-') {
      n_local = (long)(s + 1);
    }
    nk_strrev_ascii((char *)n_local);
    s_local = (char *)n_local;
  }
  return s_local;
}

Assistant:

NK_INTERN char*
nk_itoa(char *s, long n)
{
    long i = 0;
    if (n == 0) {
        s[i++] = '0';
        s[i] = 0;
        return s;
    }
    if (n < 0) {
        s[i++] = '-';
        n = -n;
    }
    while (n > 0) {
        s[i++] = (char)('0' + (n % 10));
        n /= 10;
    }
    s[i] = 0;
    if (s[0] == '-')
        ++s;

    nk_strrev_ascii(s);
    return s;
}